

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsyntaxhighlighter.cpp
# Opt level: O0

void QSyntaxHighlighter::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QSyntaxHighlighter *in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  QSyntaxHighlighterPrivate *in_RDI;
  QSyntaxHighlighter *_t;
  
  if (in_ESI == 0) {
    switch(in_EDX) {
    case 0:
      rehighlight((QSyntaxHighlighter *)in_RDI);
      break;
    case 1:
      rehighlightBlock(in_RCX,(QTextBlock *)in_RDI);
      break;
    case 2:
      d_func((QSyntaxHighlighter *)0x79b71d);
      QSyntaxHighlighterPrivate::_q_reformatBlocks
                ((QSyntaxHighlighterPrivate *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RCX >> 0x20),
                 (int)in_RCX,(int)((ulong)in_RDI >> 0x20));
      break;
    case 3:
      d_func((QSyntaxHighlighter *)0x79b752);
      QSyntaxHighlighterPrivate::_q_delayedRehighlight(in_RDI);
    }
  }
  return;
}

Assistant:

void QSyntaxHighlighter::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSyntaxHighlighter *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->rehighlight(); break;
        case 1: _t->rehighlightBlock((*reinterpret_cast< std::add_pointer_t<QTextBlock>>(_a[1]))); break;
        case 2: _t->d_func()->_q_reformatBlocks((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 3: _t->d_func()->_q_delayedRehighlight(); break;
        default: ;
        }
    }
}